

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int funcname(LexState *ls,expdesc *v)

{
  bool bVar1;
  uint local_1c;
  int ismethod;
  expdesc *v_local;
  LexState *ls_local;
  
  singlevar(ls,v);
  while ((ls->t).token == 0x2e) {
    fieldsel(ls,v);
  }
  bVar1 = (ls->t).token == 0x3a;
  if (bVar1) {
    fieldsel(ls,v);
  }
  local_1c = (uint)bVar1;
  return local_1c;
}

Assistant:

static int funcname (LexState *ls, expdesc *v) {
  /* funcname -> NAME {fieldsel} [':' NAME] */
  int ismethod = 0;
  singlevar(ls, v);
  while (ls->t.token == '.')
    fieldsel(ls, v);
  if (ls->t.token == ':') {
    ismethod = 1;
    fieldsel(ls, v);
  }
  return ismethod;
}